

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.h
# Opt level: O2

void __thiscall FONQRI::Log::~Log(Log *this)

{
  std::__cxx11::string::~string((string *)&this->type);
  std::__cxx11::string::~string((string *)&this->text);
  std::__cxx11::string::~string((string *)&this->file);
  std::__cxx11::string::~string((string *)&this->line);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Log(std::string dateTime, std::string line, std::string file,
	std::string text, std::string type)
	: dateTime(dateTime), line(line), file(file), text(text), type(type)
	{
	}